

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::MergeWireAssignmentsVisitor::extract_sliced_stmts
               (StmtBlock *block,
               set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               *sliced_stmts)

{
  bool bVar1;
  StatementType SVar2;
  VarType VVar3;
  element_type *this;
  element_type *peVar4;
  Var **ppVVar5;
  undefined1 local_48 [8];
  shared_ptr<kratos::AssignStmt> assign_stmt;
  shared_ptr<kratos::Stmt> *stmt;
  iterator __end2;
  iterator __begin2;
  StmtBlock *__range2;
  set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sliced_stmts_local;
  StmtBlock *block_local;
  
  __end2 = StmtBlock::begin(block);
  stmt = (shared_ptr<kratos::Stmt> *)StmtBlock::end(block);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                *)&stmt);
    if (!bVar1) break;
    assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
           ::operator*(&__end2);
    this = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )assign_stmt.
                       super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    SVar2 = Stmt::type(this);
    if (SVar2 == Assign) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      Stmt::as<kratos::AssignStmt>((Stmt *)local_48);
      peVar4 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      ppVVar5 = AssignStmt::left(peVar4);
      VVar3 = Var::type(*ppVVar5);
      if (VVar3 == Slice) {
        peVar4 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        ppVVar5 = AssignStmt::right(peVar4);
        VVar3 = Var::type(*ppVVar5);
        if (VVar3 == Slice) {
          std::
          set<std::shared_ptr<kratos::AssignStmt>,std::less<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
          ::emplace<std::shared_ptr<kratos::AssignStmt>&>
                    ((set<std::shared_ptr<kratos::AssignStmt>,std::less<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                      *)sliced_stmts,(shared_ptr<kratos::AssignStmt> *)local_48);
        }
      }
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_48);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void extract_sliced_stmts(StmtBlock* block,
                                     std::set<std::shared_ptr<AssignStmt>>& sliced_stmts) {
        for (auto const& stmt : *block) {
            if (stmt->type() == StatementType ::Assign) {
                auto assign_stmt = stmt->as<AssignStmt>();
                if (assign_stmt->left()->type() == VarType::Slice &&
                    assign_stmt->right()->type() == VarType::Slice) {
                    sliced_stmts.emplace(assign_stmt);
                }
            }
        }
    }